

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Marshall.c
# Opt level: O3

WJTL_STATUS TestMarshallArrayStructs(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  long lVar4;
  undefined8 *puVar5;
  JlMarshallElement *pJVar6;
  undefined8 *puVar7;
  OuterStructX theStructX;
  JlMarshallElement marshalStructX2 [1];
  JlMarshallElement marshalStructX1 [1];
  JlMarshallElement marshalOuterX [4];
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 *puStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 *puStack_290;
  undefined8 local_288;
  undefined8 local_278 [12];
  JlMarshallElement local_218;
  JlMarshallElement local_1b8;
  undefined4 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined4 local_110;
  undefined2 local_10c;
  JlMarshallElement *local_108;
  undefined4 local_100;
  undefined4 local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined2 local_ac;
  undefined8 *local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined2 local_4c;
  undefined8 *local_48;
  undefined4 local_40;
  
  puVar5 = &DAT_00142490;
  pJVar6 = &local_218;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pJVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    pJVar6 = (JlMarshallElement *)&pJVar6->Name;
  }
  local_a8 = local_278;
  puVar5 = &DAT_001424f0;
  puVar7 = local_a8;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar7 = *puVar5;
    puVar5 = puVar5 + 1;
    puVar7 = puVar7 + 1;
  }
  local_1b8.Type = JL_DATA_TYPE_DICTIONARY;
  local_1b8.Name = "struct1Fixed";
  local_1b8.IsArray = true;
  local_1b8.FieldOffset = 0;
  local_1b8.FieldSize = 0x20;
  local_1b8.CountFieldOffset = 0x20;
  local_1b8.CountFieldSize = 8;
  local_1b8.ArrayFieldSize = 0x20;
  local_1b8.ArrayItemSize = 8;
  local_1b8.NumberType = JL_NUM_TYPE_NONE;
  local_1b8.IsHex = false;
  local_1b8.IsBase64 = false;
  local_1b8.ChildStructDescriptionCount = 1;
  local_158 = 5;
  local_150 = "struct1Var";
  local_148 = 1;
  local_140 = 0x28;
  local_138 = 8;
  local_130 = 0x30;
  local_128 = 8;
  local_120 = 0;
  local_118 = 8;
  local_110 = 0;
  local_10c = 0;
  local_100 = 1;
  local_f8 = 5;
  local_f0 = "struct2Fixed";
  local_e8 = 1;
  local_e0 = 0x38;
  local_d8 = 8;
  local_d0 = 0x40;
  local_c8 = 8;
  local_c0 = 8;
  local_b8 = 2;
  local_b0 = 0;
  local_ac = 0;
  local_a0 = 1;
  local_98 = 5;
  local_90 = "struct2Var";
  local_88 = 1;
  local_80 = 0x48;
  local_78 = 8;
  local_70 = 0x50;
  local_68 = 8;
  local_60 = 0;
  local_58 = 2;
  local_50 = 0;
  local_4c = 0;
  local_40 = 1;
  local_288 = 0;
  local_298 = 0;
  puStack_290 = (undefined8 *)0x0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  puStack_2b0 = (undefined8 *)0x0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_1b8.ChildStructDescription = &local_218;
  local_108 = &local_218;
  local_48 = local_a8;
  WVar1 = MakeJsonAndVerify(&local_2d8,&local_1b8,4,
                            "{\"struct1Fixed\":[],\"struct1Var\":[],\"struct2Fixed\":[],\"struct2Var\":[]}"
                           );
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[],\\\"struct1Var\\\":[],\" \"\\\"struct2Fixed\\\":[],\\\"struct2Var\\\":[]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x260);
  local_2d8 = 1;
  uStack_2d0 = 2;
  local_2c8 = 3;
  local_2b8 = 3;
  puStack_2b0 = &local_2f8;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2f8 = 4;
  local_2f0 = 5;
  local_2a8 = 2;
  uStack_2a0 = CONCAT26(uStack_2a0._6_2_,0x800070006);
  local_298 = 3;
  puStack_290 = &local_300;
  local_300 = 0xa0009;
  local_288 = 2;
  WVar2 = MakeJsonAndVerify(&local_2d8,&local_1b8,4,
                            "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],\"struct1Var\":[{\"num64\":4},{\"num64\":5}],\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}"
                           );
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(MakeJsonAndVerify( &theStructX, marshalOuterX, ( sizeof(marshalOuterX) / sizeof((marshalOuterX)[0]) ), \"{\\\"struct1Fixed\\\":[{\\\"num64\\\":1},{\\\"num64\\\":2},{\\\"num64\\\":3}],\" \"\\\"struct1Var\\\":[{\\\"num64\\\":4},{\\\"num64\\\":5}],\" \"\\\"struct2Fixed\\\":[{\\\"num16\\\":6},{\\\"num16\\\":7},{\\\"num16\\\":8}],\" \"\\\"struct2Var\\\":[{\\\"num16\\\":9},{\\\"num16\\\":10}]}\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Marshall.c"
                   ,"TestMarshallArrayStructs",0x27b);
  WVar3 = WJTL_STATUS_FAILED;
  if (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestMarshallArrayStructs
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    typedef struct
    {
        uint64_t    Number64;
    } InnerStructX1;

    typedef struct
    {
        uint16_t    Number16;
    } InnerStructX2;

    typedef struct
    {
        InnerStructX1   struct1Fixed[4];
        size_t          struct1FixedCount;
        InnerStructX1*  struct1Var;
        size_t          struct1VarCount;
        InnerStructX2   struct2Fixed[4];
        size_t          struct2FixedCount;
        InnerStructX2*  struct2Var;
        size_t          struct2VarCount;
    } OuterStructX;

    JlMarshallElement marshalStructX1[] =
    {
        JlMarshallUnsigned( InnerStructX1, Number64, "num64" ),
    };
    JlMarshallElement marshalStructX2[] =
    {
        JlMarshallUnsigned( InnerStructX2, Number16, "num16" ),
    };
    JlMarshallElement marshalOuterX[] =
    {
        JlMarshallStructFixedArray( OuterStructX, struct1Fixed, struct1FixedCount, "struct1Fixed", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructArray( OuterStructX, struct1Var, struct1VarCount, "struct1Var", InnerStructX1, marshalStructX1, NumElements(marshalStructX1) ),
        JlMarshallStructFixedArray( OuterStructX, struct2Fixed, struct2FixedCount, "struct2Fixed", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
        JlMarshallStructArray( OuterStructX, struct2Var, struct2VarCount, "struct2Var", InnerStructX2, marshalStructX2, NumElements(marshalStructX2) ),
    };

    OuterStructX theStructX = {{{0}}};

    // Test empty
    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[],\"struct1Var\":[],"
                                          "\"struct2Fixed\":[],\"struct2Var\":[]}" ) );

    // Now with data
    theStructX.struct1Fixed[0].Number64 = 1;
    theStructX.struct1Fixed[1].Number64 = 2;
    theStructX.struct1Fixed[2].Number64 = 3;
    theStructX.struct1FixedCount = 3;
    InnerStructX1 inner1 [4] = {{0}};
    inner1[0].Number64 = 4;
    inner1[1].Number64 = 5;
    theStructX.struct1Var = inner1;
    theStructX.struct1VarCount = 2;

    theStructX.struct2Fixed[0].Number16 = 6;
    theStructX.struct2Fixed[1].Number16 = 7;
    theStructX.struct2Fixed[2].Number16 = 8;
    theStructX.struct2FixedCount = 3;
    InnerStructX2 inner2 [4] = {{0}};
    inner2[0].Number16 = 9;
    inner2[1].Number16 = 10;
    theStructX.struct2Var = inner2;
    theStructX.struct2VarCount = 2;

    JL_ASSERT_SUCCESS( MakeJsonAndVerify( &theStructX, marshalOuterX, NumElements(marshalOuterX),
                                          "{\"struct1Fixed\":[{\"num64\":1},{\"num64\":2},{\"num64\":3}],"
                                          "\"struct1Var\":[{\"num64\":4},{\"num64\":5}],"
                                          "\"struct2Fixed\":[{\"num16\":6},{\"num16\":7},{\"num16\":8}],"
                                          "\"struct2Var\":[{\"num16\":9},{\"num16\":10}]}" ) );

    return TestReturn;
}